

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsWindowChildOf(ImGuiWindow *window,ImGuiWindow *potential_parent,bool popup_hierarchy)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  
  pIVar2 = window;
  if (window == (ImGuiWindow *)0x0) {
    return potential_parent == (ImGuiWindow *)0x0;
  }
  do {
    pIVar1 = pIVar2;
    pIVar2 = pIVar1->RootWindow;
    if (popup_hierarchy) {
      pIVar2 = pIVar2->RootWindowPopupTree;
    }
  } while (pIVar1 != pIVar2);
  bVar3 = pIVar1 == potential_parent;
  if (window != (ImGuiWindow *)0x0 && !bVar3) {
    do {
      bVar3 = window == potential_parent;
      if (bVar3) {
        return bVar3;
      }
      if (window == pIVar1) {
        return bVar3;
      }
      window = window->ParentWindow;
    } while (window != (ImGuiWindow *)0x0);
  }
  return bVar3;
}

Assistant:

static ImGuiWindow* GetCombinedRootWindow(ImGuiWindow* window, bool popup_hierarchy)
{
    ImGuiWindow* last_window = NULL;
    while (last_window != window)
    {
        last_window = window;
        window = window->RootWindow;
        if (popup_hierarchy)
            window = window->RootWindowPopupTree;
    }
    return window;
}